

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O2

void __thiscall bloaty::Bloaty::AddFilename(Bloaty *this,string *filename,bool is_base)

{
  pointer *__ptr;
  string build_id;
  undefined1 local_88 [8];
  undefined1 local_80 [64];
  string local_40 [32];
  
  GetObjectFile((Bloaty *)local_88,(string *)this);
  (*(*(_func_int ***)local_88)[2])(local_40);
  if (is_base) {
    std::__cxx11::string::string((string *)local_80,(string *)filename);
    std::__cxx11::string::string((string *)(local_80 + 0x20),local_40);
    std::vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>::
    emplace_back<bloaty::Bloaty::InputFileInfo>(&this->base_files_,(InputFileInfo *)local_80);
  }
  else {
    std::__cxx11::string::string((string *)local_80,(string *)filename);
    std::__cxx11::string::string((string *)(local_80 + 0x20),local_40);
    std::vector<bloaty::Bloaty::InputFileInfo,_std::allocator<bloaty::Bloaty::InputFileInfo>_>::
    emplace_back<bloaty::Bloaty::InputFileInfo>(&this->input_files_,(InputFileInfo *)local_80);
  }
  InputFileInfo::~InputFileInfo((InputFileInfo *)local_80);
  std::__cxx11::string::~string(local_40);
  if (local_88 != (undefined1  [8])0x0) {
    (*(*(_func_int ***)local_88)[1])();
  }
  return;
}

Assistant:

void Bloaty::AddFilename(const std::string& filename, bool is_base) {
  auto object_file = GetObjectFile(filename);
  std::string build_id = object_file->GetBuildId();

  if (is_base) {
    base_files_.push_back({filename, build_id});
  } else {
    input_files_.push_back({filename, build_id});
  }
}